

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode recv_CONNECT_resp(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts,_Bool *done
                          )

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Bool _Var6;
  int iVar7;
  CURLcode CVar8;
  uint uVar9;
  size_t local_70;
  size_t consumed;
  long lStack_60;
  char byte;
  ssize_t nread;
  int writetype;
  int error;
  size_t line_len;
  char *linep;
  SingleRequest *k;
  _Bool *p_Stack_30;
  CURLcode result;
  _Bool *done_local;
  h1_tunnel_state_conflict *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  k._4_4_ = CURLE_OK;
  linep = (char *)&data->req;
  nread._4_4_ = 0;
  *done = false;
  p_Stack_30 = done;
  done_local = (_Bool *)ts;
  ts_local = (h1_tunnel_state_conflict *)data;
  data_local = (Curl_easy *)cf;
  _Var6 = Curl_conn_data_pending(data,cf->sockindex);
  if (_Var6) {
    do {
      while( true ) {
        while( true ) {
          if (*(int *)(done_local + 0x98) == 0) goto LAB_00117950;
          k._4_4_ = Curl_conn_recv((Curl_easy *)ts_local,*(int *)&data_local->conn,
                                   (char *)((long)&consumed + 7),1,&stack0xffffffffffffffa0);
          if (k._4_4_ == CURLE_AGAIN) {
            return CURLE_OK;
          }
          iVar7 = Curl_pgrsUpdate((Curl_easy *)ts_local);
          if (iVar7 != 0) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
          if (k._4_4_ != CURLE_OK) {
            done_local[0x98] = false;
            done_local[0x99] = false;
            done_local[0x9a] = false;
            done_local[0x9b] = false;
            goto LAB_00117950;
          }
          if (lStack_60 < 1) {
            if (((ts_local[2].ch.trailer.leng == 0) || (ts_local[0x13].rcvbuf.allc == 0)) ||
               (ts_local[0x1c].ch.trailer.bufr == (char *)0x0)) {
              nread._4_4_ = 1;
              Curl_failf((Curl_easy *)ts_local,"Proxy CONNECT aborted");
            }
            else {
              done_local[0xac] = (_Bool)(done_local[0xac] & 0xfdU | 2);
              if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                  ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
                 ((lVar1._0_1_ = ts_local[0x1b].ch.hexindex,
                  lVar1._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                  lVar1._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                  lVar1._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                  lVar1._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                  lVar1._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                  lVar1._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                  lVar1._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar1 == 0 ||
                  (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
                Curl_infof((Curl_easy *)ts_local,"Proxy CONNECT connection closed");
              }
            }
            done_local[0x98] = false;
            done_local[0x99] = false;
            done_local[0x9a] = false;
            done_local[0x9b] = false;
            goto LAB_00117950;
          }
          if (*(int *)(done_local + 0x98) == 2) break;
          CVar8 = Curl_dyn_addn((dynbuf *)done_local,(void *)((long)&consumed + 7),1);
          if (CVar8 != CURLE_OK) {
            Curl_failf((Curl_easy *)ts_local,"CONNECT response too large");
            return CURLE_RECV_ERROR;
          }
          if (consumed._7_1_ == '\n') {
            *(long *)(done_local + 0x48) = *(long *)(done_local + 0x48) + 1;
            line_len = (size_t)Curl_dyn_ptr((dynbuf *)done_local);
            _writetype = Curl_dyn_len((dynbuf *)done_local);
            Curl_debug((Curl_easy *)ts_local,CURLINFO_HEADER_IN,(char *)line_len,_writetype);
            uVar9 = 0;
            if (*(long *)(done_local + 0x48) == 1) {
              uVar9 = 8;
            }
            nread._0_4_ = uVar9 | 0x14;
            k._4_4_ = Curl_client_write((Curl_easy *)ts_local,(uint)nread,(char *)line_len,
                                        _writetype);
            if (k._4_4_ != CURLE_OK) {
              return k._4_4_;
            }
            k._4_4_ = Curl_bump_headersize((Curl_easy *)ts_local,_writetype,true);
            if (k._4_4_ != CURLE_OK) {
              return k._4_4_;
            }
            if ((*(char *)line_len == '\r') || (*(char *)line_len == '\n')) {
              if ((*(int *)(linep + 0x48) == 0x197) &&
                 ((*(uint *)((long)&ts_local[0x1c].ch.trailer.toobig + 6) >> 7 & 1) == 0)) {
                done_local[0x98] = true;
                done_local[0x99] = false;
                done_local[0x9a] = false;
                done_local[0x9b] = false;
                if (*(long *)(done_local + 0xa0) == 0) {
                  if ((done_local[0xac] & 1U) == 0) {
                    if ((((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                         ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
                        ((lVar5._0_1_ = ts_local[0x1b].ch.hexindex,
                         lVar5._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                         lVar5._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                         lVar5._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                         lVar5._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                         lVar5._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                         lVar5._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                         lVar5._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar5 == 0 ||
                         (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) &&
                       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))
                        ))) {
                      Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,
                                        "CONNECT: no content-length or chunked");
                    }
                    done_local[0x98] = false;
                    done_local[0x99] = false;
                    done_local[0x9a] = false;
                    done_local[0x9b] = false;
                  }
                  else if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                           ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
                          ((lVar4._0_1_ = ts_local[0x1b].ch.hexindex,
                           lVar4._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                           lVar4._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                           lVar4._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                           lVar4._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                           lVar4._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                           lVar4._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                           lVar4._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar4 == 0 ||
                           (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
                    Curl_infof((Curl_easy *)ts_local,"Ignore chunked response-body");
                  }
                }
                else if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                         ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
                        ((lVar3._0_1_ = ts_local[0x1b].ch.hexindex,
                         lVar3._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                         lVar3._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                         lVar3._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                         lVar3._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                         lVar3._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                         lVar3._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                         lVar3._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar3 == 0 ||
                         (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
                  Curl_infof((Curl_easy *)ts_local,"Ignore %ld bytes of response-body",
                             *(undefined8 *)(done_local + 0xa0));
                }
              }
              else {
                done_local[0x98] = false;
                done_local[0x99] = false;
                done_local[0x9a] = false;
                done_local[0x9b] = false;
              }
            }
            else {
              k._4_4_ = on_resp_header((Curl_cfilter *)data_local,(Curl_easy *)ts_local,
                                       (h1_tunnel_state_conflict *)done_local,(char *)line_len);
              if (k._4_4_ != CURLE_OK) {
                return k._4_4_;
              }
              Curl_dyn_reset((dynbuf *)done_local);
            }
          }
        }
        if (*(long *)(done_local + 0xa0) != 0) break;
        if ((done_local[0xac] & 1U) != 0) {
          local_70 = 0;
          k._4_4_ = Curl_httpchunk_read((Curl_easy *)ts_local,(Curl_chunker *)(done_local + 0x50),
                                        (char *)((long)&consumed + 7),1,&local_70);
          if (k._4_4_ != CURLE_OK) {
            return k._4_4_;
          }
          _Var6 = Curl_httpchunk_is_done((Curl_easy *)ts_local,(Curl_chunker *)(done_local + 0x50));
          if (_Var6) {
            if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
               ((lVar2._0_1_ = ts_local[0x1b].ch.hexindex,
                lVar2._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                lVar2._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                lVar2._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                lVar2._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                lVar2._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                lVar2._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                lVar2._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar2 == 0 ||
                (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
              Curl_infof((Curl_easy *)ts_local,"chunk reading DONE");
            }
            done_local[0x98] = false;
            done_local[0x99] = false;
            done_local[0x9a] = false;
            done_local[0x9b] = false;
          }
        }
      }
      *(long *)(done_local + 0xa0) = *(long *)(done_local + 0xa0) + -1;
    } while (0 < *(long *)(done_local + 0xa0));
    done_local[0x98] = false;
    done_local[0x99] = false;
    done_local[0x9a] = false;
    done_local[0x9b] = false;
LAB_00117950:
    if (nread._4_4_ != 0) {
      k._4_4_ = CURLE_RECV_ERROR;
    }
    *p_Stack_30 = *(int *)(done_local + 0x98) == 0;
    if (((k._4_4_ == CURLE_OK) && ((*p_Stack_30 & 1U) != 0)) &&
       (*(int *)&ts_local[0x1c].ch.field_0x44 / 100 != 2)) {
      k._4_4_ = Curl_http_auth_act((Curl_easy *)ts_local);
    }
    cf_local._4_4_ = k._4_4_;
  }
  else {
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode recv_CONNECT_resp(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct h1_tunnel_state *ts,
                                  bool *done)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  char *linep;
  size_t line_len;
  int error, writetype;

#define SELECT_OK      0
#define SELECT_ERROR   1

  error = SELECT_OK;
  *done = FALSE;

  if(!Curl_conn_data_pending(data, cf->sockindex))
    return CURLE_OK;

  while(ts->keepon) {
    ssize_t nread;
    char byte;

    /* Read one byte at a time to avoid a race condition. Wait at most one
       second before looping to ensure continuous pgrsUpdates. */
    result = Curl_conn_recv(data, cf->sockindex, &byte, 1, &nread);
    if(result == CURLE_AGAIN)
      /* socket buffer drained, return */
      return CURLE_OK;

    if(Curl_pgrsUpdate(data))
      return CURLE_ABORTED_BY_CALLBACK;

    if(result) {
      ts->keepon = KEEPON_DONE;
      break;
    }

    if(nread <= 0) {
      if(data->set.proxyauth && data->state.authproxy.avail &&
         data->state.aptr.proxyuserpwd) {
        /* proxy auth was requested and there was proxy auth available,
           then deem this as "mere" proxy disconnect */
        ts->close_connection = TRUE;
        infof(data, "Proxy CONNECT connection closed");
      }
      else {
        error = SELECT_ERROR;
        failf(data, "Proxy CONNECT aborted");
      }
      ts->keepon = KEEPON_DONE;
      break;
    }

    if(ts->keepon == KEEPON_IGNORE) {
      /* This means we are currently ignoring a response-body */

      if(ts->cl) {
        /* A Content-Length based body: simply count down the counter
           and make sure to break out of the loop when we are done! */
        ts->cl--;
        if(ts->cl <= 0) {
          ts->keepon = KEEPON_DONE;
          break;
        }
      }
      else if(ts->chunked_encoding) {
        /* chunked-encoded body, so we need to do the chunked dance
           properly to know when the end of the body is reached */
        size_t consumed = 0;

        /* now parse the chunked piece of data so that we can
           properly tell when the stream ends */
        result = Curl_httpchunk_read(data, &ts->ch, &byte, 1, &consumed);
        if(result)
          return result;
        if(Curl_httpchunk_is_done(data, &ts->ch)) {
          /* we are done reading chunks! */
          infof(data, "chunk reading DONE");
          ts->keepon = KEEPON_DONE;
        }
      }
      continue;
    }

    if(Curl_dyn_addn(&ts->rcvbuf, &byte, 1)) {
      failf(data, "CONNECT response too large");
      return CURLE_RECV_ERROR;
    }

    /* if this is not the end of a header line then continue */
    if(byte != 0x0a)
      continue;

    ts->headerlines++;
    linep = Curl_dyn_ptr(&ts->rcvbuf);
    line_len = Curl_dyn_len(&ts->rcvbuf); /* amount of bytes in this line */

    /* output debug if that is requested */
    Curl_debug(data, CURLINFO_HEADER_IN, linep, line_len);

    /* send the header to the callback */
    writetype = CLIENTWRITE_HEADER | CLIENTWRITE_CONNECT |
      (ts->headerlines == 1 ? CLIENTWRITE_STATUS : 0);
    result = Curl_client_write(data, writetype, linep, line_len);
    if(result)
      return result;

    result = Curl_bump_headersize(data, line_len, TRUE);
    if(result)
      return result;

    /* Newlines are CRLF, so the CR is ignored as the line is not
       really terminated until the LF comes. Treat a following CR
       as end-of-headers as well.*/

    if(('\r' == linep[0]) ||
       ('\n' == linep[0])) {
      /* end of response-headers from the proxy */

      if((407 == k->httpcode) && !data->state.authproblem) {
        /* If we get a 407 response code with content length
           when we have no auth problem, we must ignore the
           whole response-body */
        ts->keepon = KEEPON_IGNORE;

        if(ts->cl) {
          infof(data, "Ignore %" FMT_OFF_T " bytes of response-body", ts->cl);
        }
        else if(ts->chunked_encoding) {
          infof(data, "Ignore chunked response-body");
        }
        else {
          /* without content-length or chunked encoding, we
             cannot keep the connection alive since the close is
             the end signal so we bail out at once instead */
          CURL_TRC_CF(data, cf, "CONNECT: no content-length or chunked");
          ts->keepon = KEEPON_DONE;
        }
      }
      else {
        ts->keepon = KEEPON_DONE;
      }

      DEBUGASSERT(ts->keepon == KEEPON_IGNORE
                  || ts->keepon == KEEPON_DONE);
      continue;
    }

    result = on_resp_header(cf, data, ts, linep);
    if(result)
      return result;

    Curl_dyn_reset(&ts->rcvbuf);
  } /* while there is buffer left and loop is requested */

  if(error)
    result = CURLE_RECV_ERROR;
  *done = (ts->keepon == KEEPON_DONE);
  if(!result && *done && data->info.httpproxycode/100 != 2) {
    /* Deal with the possibly already received authenticate
       headers. 'newurl' is set to a new URL if we must loop. */
    result = Curl_http_auth_act(data);
  }
  return result;
}